

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csprng.cpp
# Opt level: O2

csprng_engine * jbcoin::crypto_prng(void)

{
  int iVar1;
  
  if (crypto_prng()::engine == '\0') {
    iVar1 = __cxa_guard_acquire(&crypto_prng()::engine);
    if (iVar1 != 0) {
      csprng_engine::csprng_engine(&crypto_prng::engine);
      __cxa_guard_release(&crypto_prng()::engine);
    }
  }
  return &crypto_prng::engine;
}

Assistant:

csprng_engine& crypto_prng()
{
    static csprng_engine engine;
    return engine;
}